

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O1

void __thiscall sf::Texture::update(Texture *this,Texture *texture,uint x,uint y)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Uint64 UVar4;
  GLenum GVar5;
  GLenum GVar6;
  ostream *poVar7;
  uint uVar8;
  TransientContextLock lock_1;
  GLuint destFrameBuffer;
  TextureSaver save;
  GLuint sourceFrameBuffer;
  GLint drawFramebuffer;
  GLint readFramebuffer;
  TransientContextLock lock;
  
  if ((this->m_size).x < (texture->m_size).x + x) {
    __assert_fail("x + texture.m_size.x <= m_size.x",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                  ,0x1c1,"void sf::Texture::update(const Texture &, unsigned int, unsigned int)");
  }
  if ((this->m_size).y < (texture->m_size).y + y) {
    __assert_fail("y + texture.m_size.y <= m_size.y",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                  ,0x1c2,"void sf::Texture::update(const Texture &, unsigned int, unsigned int)");
  }
  if ((this->m_texture != 0) && (texture->m_texture != 0)) {
    GlResource::TransientContextLock::TransientContextLock(&lock);
    priv::ensureExtensionsInit();
    GlResource::TransientContextLock::~TransientContextLock(&lock);
    if ((sfogl_ext_EXT_framebuffer_object == 0) || (sfogl_ext_EXT_framebuffer_blit == 0)) {
      copyToImage((Image *)&lock,texture);
      update(this,(Image *)&lock,x,y);
      Image::~Image((Image *)&lock);
    }
    else {
      GlResource::TransientContextLock::TransientContextLock(&lock_1);
      readFramebuffer = 0;
      drawFramebuffer = 0;
      glGetIntegerv(0x8caa);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                         ,0x1d8,"glGetIntegerv(GLEXT_GL_READ_FRAMEBUFFER_BINDING, &readFramebuffer)"
                        );
      glGetIntegerv(0x8ca6,&drawFramebuffer);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                         ,0x1d9,"glGetIntegerv(GLEXT_GL_DRAW_FRAMEBUFFER_BINDING, &drawFramebuffer)"
                        );
      sourceFrameBuffer = 0;
      destFrameBuffer = 0;
      (*sf_ptrc_glGenFramebuffersEXT)(1,&sourceFrameBuffer);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                         ,0x1de,"GLEXT_glGenFramebuffers(1, &sourceFrameBuffer)");
      (*sf_ptrc_glGenFramebuffersEXT)(1,&destFrameBuffer);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                         ,0x1df,"GLEXT_glGenFramebuffers(1, &destFrameBuffer)");
      if ((sourceFrameBuffer == 0) || (destFrameBuffer == 0)) {
        poVar7 = err();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"Cannot copy texture, failed to create a frame buffer object",0x3b);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
      }
      else {
        (*sf_ptrc_glBindFramebufferEXT)(0x8ca8,sourceFrameBuffer);
        priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                           ,0x1e8,
                           "GLEXT_glBindFramebuffer(GLEXT_GL_READ_FRAMEBUFFER, sourceFrameBuffer)");
        (*sf_ptrc_glFramebufferTexture2DEXT)(0x8ca8,0x8ce0,0xde1,texture->m_texture,0);
        priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                           ,0x1e9,
                           "GLEXT_glFramebufferTexture2D(GLEXT_GL_READ_FRAMEBUFFER, GLEXT_GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, texture.m_texture, 0)"
                          );
        (*sf_ptrc_glBindFramebufferEXT)(0x8ca9,destFrameBuffer);
        priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                           ,0x1ec,
                           "GLEXT_glBindFramebuffer(GLEXT_GL_DRAW_FRAMEBUFFER, destFrameBuffer)");
        (*sf_ptrc_glFramebufferTexture2DEXT)(0x8ca9,0x8ce0,0xde1,this->m_texture,0);
        priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                           ,0x1ed,
                           "GLEXT_glFramebufferTexture2D(GLEXT_GL_DRAW_FRAMEBUFFER, GLEXT_GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_texture, 0)"
                          );
        GVar5 = (*sf_ptrc_glCheckFramebufferStatusEXT)(0x8ca8);
        priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                           ,0x1f1,
                           "sourceStatus = GLEXT_glCheckFramebufferStatus(GLEXT_GL_READ_FRAMEBUFFER)"
                          );
        GVar6 = (*sf_ptrc_glCheckFramebufferStatusEXT)(0x8ca9);
        priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                           ,500,
                           "destStatus = GLEXT_glCheckFramebufferStatus(GLEXT_GL_DRAW_FRAMEBUFFER)")
        ;
        if ((GVar5 == 0x8cd5) && (GVar6 == 0x8cd5)) {
          uVar1 = (texture->m_size).x;
          uVar2 = (texture->m_size).y;
          uVar8 = uVar2;
          uVar3 = 0;
          if (texture->m_pixelsFlipped != false) {
            uVar8 = 0;
            uVar3 = uVar2;
          }
          (*sf_ptrc_glBlitFramebufferEXT)(0,uVar3,uVar1,uVar8,x,y,uVar1 + x,uVar2 + y,0x4000,0x2600)
          ;
          priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                             ,0x1fd,
                             "GLEXT_glBlitFramebuffer( 0, texture.m_pixelsFlipped ? texture.m_size.y : 0, texture.m_size.x, texture.m_pixelsFlipped ? 0 : texture.m_size.y, x, y, x + texture.m_size.x, y + texture.m_size.y, GL_COLOR_BUFFER_BIT, GL_NEAREST )"
                            );
        }
        else {
          poVar7 = err();
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,"Cannot copy texture, failed to link texture to frame buffer",0x3b);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
        }
        (*sf_ptrc_glBindFramebufferEXT)(0x8ca8,readFramebuffer);
        priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                           ,0x205,
                           "GLEXT_glBindFramebuffer(GLEXT_GL_READ_FRAMEBUFFER, readFramebuffer)");
        (*sf_ptrc_glBindFramebufferEXT)(0x8ca9,drawFramebuffer);
        priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                           ,0x206,
                           "GLEXT_glBindFramebuffer(GLEXT_GL_DRAW_FRAMEBUFFER, drawFramebuffer)");
        (*sf_ptrc_glDeleteFramebuffersEXT)(1,&sourceFrameBuffer);
        priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                           ,0x209,"GLEXT_glDeleteFramebuffers(1, &sourceFrameBuffer)");
        (*sf_ptrc_glDeleteFramebuffersEXT)(1,&destFrameBuffer);
        priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                           ,0x20a,"GLEXT_glDeleteFramebuffers(1, &destFrameBuffer)");
        priv::TextureSaver::TextureSaver(&save);
        glBindTexture(0xde1,this->m_texture);
        priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                           ,0x210,"glBindTexture(GL_TEXTURE_2D, m_texture)");
        glTexParameteri(0xde1,0x2801,this->m_isSmooth | 0x2600);
        priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                           ,0x211,
                           "glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST)"
                          );
        this->m_hasMipmap = false;
        this->m_pixelsFlipped = false;
        Lock::Lock((Lock *)&lock,(Mutex *)&(anonymous_namespace)::idMutex);
        UVar4 = (anonymous_namespace)::getUniqueId()::id;
        (anonymous_namespace)::getUniqueId()::id = (anonymous_namespace)::getUniqueId()::id + 1;
        Lock::~Lock((Lock *)&lock);
        this->m_cacheId = UVar4;
        glFlush();
        priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                           ,0x218,"glFlush()");
        priv::TextureSaver::~TextureSaver(&save);
      }
      GlResource::TransientContextLock::~TransientContextLock(&lock_1);
    }
  }
  return;
}

Assistant:

void Texture::update(const Texture& texture, unsigned int x, unsigned int y)
{
    assert(x + texture.m_size.x <= m_size.x);
    assert(y + texture.m_size.y <= m_size.y);

    if (!m_texture || !texture.m_texture)
        return;

#ifndef SFML_OPENGL_ES

    {
        TransientContextLock lock;

        // Make sure that extensions are initialized
        priv::ensureExtensionsInit();
    }

    if (GLEXT_framebuffer_object && GLEXT_framebuffer_blit)
    {
        TransientContextLock lock;

        // Save the current bindings so we can restore them after we are done
        GLint readFramebuffer = 0;
        GLint drawFramebuffer = 0;

        glCheck(glGetIntegerv(GLEXT_GL_READ_FRAMEBUFFER_BINDING, &readFramebuffer));
        glCheck(glGetIntegerv(GLEXT_GL_DRAW_FRAMEBUFFER_BINDING, &drawFramebuffer));

        // Create the framebuffers
        GLuint sourceFrameBuffer = 0;
        GLuint destFrameBuffer = 0;
        glCheck(GLEXT_glGenFramebuffers(1, &sourceFrameBuffer));
        glCheck(GLEXT_glGenFramebuffers(1, &destFrameBuffer));

        if (!sourceFrameBuffer || !destFrameBuffer)
        {
            err() << "Cannot copy texture, failed to create a frame buffer object" << std::endl;
            return;
        }

        // Link the source texture to the source frame buffer
        glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_READ_FRAMEBUFFER, sourceFrameBuffer));
        glCheck(GLEXT_glFramebufferTexture2D(GLEXT_GL_READ_FRAMEBUFFER, GLEXT_GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, texture.m_texture, 0));

        // Link the destination texture to the destination frame buffer
        glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_DRAW_FRAMEBUFFER, destFrameBuffer));
        glCheck(GLEXT_glFramebufferTexture2D(GLEXT_GL_DRAW_FRAMEBUFFER, GLEXT_GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_texture, 0));

        // A final check, just to be sure...
        GLenum sourceStatus;
        glCheck(sourceStatus = GLEXT_glCheckFramebufferStatus(GLEXT_GL_READ_FRAMEBUFFER));

        GLenum destStatus;
        glCheck(destStatus = GLEXT_glCheckFramebufferStatus(GLEXT_GL_DRAW_FRAMEBUFFER));

        if ((sourceStatus == GLEXT_GL_FRAMEBUFFER_COMPLETE) && (destStatus == GLEXT_GL_FRAMEBUFFER_COMPLETE))
        {
            // Blit the texture contents from the source to the destination texture
            glCheck(GLEXT_glBlitFramebuffer(
                0, texture.m_pixelsFlipped ? texture.m_size.y : 0, texture.m_size.x, texture.m_pixelsFlipped ? 0 : texture.m_size.y, // Source rectangle, flip y if source is flipped
                x, y, x + texture.m_size.x, y + texture.m_size.y, // Destination rectangle
                GL_COLOR_BUFFER_BIT, GL_NEAREST
            ));
        }
        else
        {
            err() << "Cannot copy texture, failed to link texture to frame buffer" << std::endl;
        }

        // Restore previously bound framebuffers
        glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_READ_FRAMEBUFFER, readFramebuffer));
        glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_DRAW_FRAMEBUFFER, drawFramebuffer));

        // Delete the framebuffers
        glCheck(GLEXT_glDeleteFramebuffers(1, &sourceFrameBuffer));
        glCheck(GLEXT_glDeleteFramebuffers(1, &destFrameBuffer));

        // Make sure that the current texture binding will be preserved
        priv::TextureSaver save;

        // Set the parameters of this texture
        glCheck(glBindTexture(GL_TEXTURE_2D, m_texture));
        glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST));
        m_hasMipmap = false;
        m_pixelsFlipped = false;
        m_cacheId = getUniqueId();

        // Force an OpenGL flush, so that the texture data will appear updated
        // in all contexts immediately (solves problems in multi-threaded apps)
        glCheck(glFlush());

        return;
    }

#endif // SFML_OPENGL_ES

    update(texture.copyToImage(), x, y);
}